

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void eye(double *mat,int N)

{
  int local_1c;
  int t;
  int j;
  int i;
  int N_local;
  double *mat_local;
  
  for (t = 0; t < N; t = t + 1) {
    for (local_1c = 0; local_1c < N; local_1c = local_1c + 1) {
      if (t == local_1c) {
        mat[t * N + local_1c] = 1.0;
      }
      else {
        mat[t * N + local_1c] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void eye(double *mat,int N) {
	int i,j,t;
	for(i = 0;i < N;++i) {
		for(j =0; j < N;++j) {
			t = i*N;
			if (i == j) {
				mat[t+j] = 1.;
			} else {
				mat[t+j] = 0.;
			}
		}
		
	}
}